

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QPainterPath qt_regionToPath(QRegion *region)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_iterator pQVar4;
  reference pvVar5;
  socklen_t __len;
  sockaddr *__addr;
  QRegion *in_RSI;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  Segment *segment;
  int i_1;
  int j;
  int offset;
  int i;
  int count;
  int y;
  int lastY;
  int lastSegment;
  Segment *lastRowSegments;
  int lastRowSegmentCount;
  const_iterator end;
  const_iterator rect;
  QPainterPath *result;
  QVarLengthArray<(anonymous_namespace)::Segment,_256LL> segments;
  int in_stack_ffffffffffffde48;
  int in_stack_ffffffffffffde4c;
  QVarLengthArray<(anonymous_namespace)::Segment,_256LL> *in_stack_ffffffffffffde50;
  int in_stack_ffffffffffffde58;
  int in_stack_ffffffffffffde5c;
  QRectF *in_stack_ffffffffffffde60;
  undefined4 in_stack_ffffffffffffde68;
  uint in_stack_ffffffffffffde6c;
  QExplicitlySharedDataPointer<QPainterPathPrivate> QVar6;
  Segment *in_stack_ffffffffffffde80;
  int local_2178;
  int local_2174;
  int local_216c;
  int local_2168;
  undefined4 in_stack_ffffffffffffdea0;
  int iVar7;
  undefined4 in_stack_ffffffffffffdea4;
  QPainterPath *in_stack_ffffffffffffdea8;
  QVarLengthArray<(anonymous_namespace)::Segment,_256LL> *pQVar8;
  int local_214c;
  const_iterator local_2140;
  QPoint local_2110;
  Segment local_2108;
  QPoint local_20e0;
  QPoint local_20d8;
  Segment local_20d0;
  QPoint local_20a8;
  QPoint local_20a0;
  Segment local_2098;
  QPoint local_2078;
  Segment local_2070;
  QRect local_2050;
  QVarLengthArray<(anonymous_namespace)::Segment,_256LL> local_2020;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  QVar6.d.ptr = (totally_ordered_wrapper<QPainterPathPrivate_*>)
                (totally_ordered_wrapper<QPainterPathPrivate_*>)in_RDI;
  QPainterPath::QPainterPath((QPainterPath *)0x651e10);
  iVar1 = QRegion::rectCount(in_RSI);
  if (iVar1 == 1) {
    local_2050 = QRegion::boundingRect
                           ((QRegion *)CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58)
                           );
    QRectF::QRectF(in_stack_ffffffffffffde60,
                   (QRect *)CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58));
    QPainterPath::addRect
              (in_stack_ffffffffffffdea8,
               (QRectF *)CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0));
  }
  else {
    local_2140 = QRegion::begin((QRegion *)in_stack_ffffffffffffde50);
    pQVar4 = QRegion::end((QRegion *)in_stack_ffffffffffffde50);
    memset(&local_2020,0xaa,0x2018);
    QVarLengthArray<(anonymous_namespace)::Segment,_256LL>::QVarLengthArray(&local_2020);
    QVarLengthArray<(anonymous_namespace)::Segment,_256LL>::resize
              (in_stack_ffffffffffffde50,
               CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48));
    local_214c = 0;
    pQVar8 = (QVarLengthArray<(anonymous_namespace)::Segment,_256LL> *)0x0;
    iVar1 = 0;
    iVar7 = 0;
    for (; local_2140 != pQVar4; local_2140 = local_2140 + local_2168) {
      iVar2 = QRect::y((QRect *)0x651f23);
      local_2168 = 0;
      while( true ) {
        in_stack_ffffffffffffde6c = in_stack_ffffffffffffde6c & 0xffffff;
        if (local_2140 + local_2168 != pQVar4) {
          iVar3 = QRect::y((QRect *)0x651f63);
          in_stack_ffffffffffffde6c = CONCAT13(iVar3 == iVar2,(int3)in_stack_ffffffffffffde6c);
        }
        if ((char)(in_stack_ffffffffffffde6c >> 0x18) == '\0') break;
        local_2168 = local_2168 + 1;
      }
      for (local_216c = 0; local_216c < local_2168; local_216c = local_216c + 1) {
        local_2078 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffde4c,
                                                      in_stack_ffffffffffffde48));
        anon_unknown.dwarf_ea51c5::Segment::Segment(&local_2070,&local_2078);
        pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                           ((QVLABase<(anonymous_namespace)::Segment> *)
                            CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x651fec);
        *(undefined4 *)&pvVar5->field_0x0 = local_2070._0_4_;
        (pvVar5->point).xp = (Representation)local_2070.point.xp.m_i;
        *(undefined8 *)&(pvVar5->point).yp = local_2070._8_8_;
        pvVar5->prev = local_2070.prev;
        pvVar5->next = local_2070.next;
        local_20a8 = QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffde4c,
                                                       in_stack_ffffffffffffde48));
        QPoint::QPoint((QPoint *)in_stack_ffffffffffffde50,in_stack_ffffffffffffde4c,
                       in_stack_ffffffffffffde48);
        local_20a0 = operator+((QPoint *)in_stack_ffffffffffffde60,
                               (QPoint *)
                               CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58));
        anon_unknown.dwarf_ea51c5::Segment::Segment(&local_2098,&local_20a0);
        pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                           ((QVLABase<(anonymous_namespace)::Segment> *)
                            CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x65209b);
        *(undefined4 *)&pvVar5->field_0x0 = local_2098._0_4_;
        (pvVar5->point).xp = (Representation)local_2098.point.xp.m_i;
        *(undefined8 *)&(pvVar5->point).yp = local_2098._8_8_;
        pvVar5->prev = local_2098.prev;
        pvVar5->next = local_2098.next;
        local_20e0 = QRect::bottomRight((QRect *)CONCAT44(in_stack_ffffffffffffde4c,
                                                          in_stack_ffffffffffffde48));
        QPoint::QPoint((QPoint *)in_stack_ffffffffffffde50,in_stack_ffffffffffffde4c,
                       in_stack_ffffffffffffde48);
        local_20d8 = operator+((QPoint *)in_stack_ffffffffffffde60,
                               (QPoint *)
                               CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58));
        anon_unknown.dwarf_ea51c5::Segment::Segment(&local_20d0,&local_20d8);
        pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                           ((QVLABase<(anonymous_namespace)::Segment> *)
                            CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x65214a);
        *(undefined4 *)&pvVar5->field_0x0 = local_20d0._0_4_;
        (pvVar5->point).xp = (Representation)local_20d0.point.xp.m_i;
        *(undefined8 *)&(pvVar5->point).yp = local_20d0._8_8_;
        pvVar5->prev = local_20d0.prev;
        pvVar5->next = local_20d0.next;
        QRect::bottomLeft((QRect *)CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48));
        QPoint::QPoint((QPoint *)in_stack_ffffffffffffde50,in_stack_ffffffffffffde4c,
                       in_stack_ffffffffffffde48);
        local_2110 = operator+((QPoint *)in_stack_ffffffffffffde60,
                               (QPoint *)
                               CONCAT44(in_stack_ffffffffffffde5c,in_stack_ffffffffffffde58));
        anon_unknown.dwarf_ea51c5::Segment::Segment(&local_2108,&local_2110);
        pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                           ((QVLABase<(anonymous_namespace)::Segment> *)
                            CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x6521f9);
        *(undefined4 *)&pvVar5->field_0x0 = local_2108._0_4_;
        (pvVar5->point).xp = (Representation)local_2108.point.xp.m_i;
        *(undefined8 *)&(pvVar5->point).yp = local_2108._8_8_;
        pvVar5->prev = local_2108.prev;
        pvVar5->next = local_2108.next;
        iVar3 = iVar1 + local_216c;
        for (local_2174 = 0; local_2174 < 4; local_2174 = local_2174 + 1) {
          in_stack_ffffffffffffde60 =
               (QRectF *)
               QVLABase<(anonymous_namespace)::Segment>::operator[]
                         ((QVLABase<(anonymous_namespace)::Segment> *)
                          CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x652262);
          __len = 4;
          in_stack_ffffffffffffde5c = iVar3;
          pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                             ((QVLABase<(anonymous_namespace)::Segment> *)
                              CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x652299
                             );
          anon_unknown.dwarf_ea51c5::Segment::connect
                    ((Segment *)in_stack_ffffffffffffde60,(int)pvVar5,__addr,__len);
        }
      }
      if ((pQVar8 != (QVarLengthArray<(anonymous_namespace)::Segment,_256LL> *)0x0) &&
         (iVar7 == iVar2)) {
        QVLABase<(anonymous_namespace)::Segment>::operator[]
                  ((QVLABase<(anonymous_namespace)::Segment> *)
                   CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x6522fb);
        anon_unknown.dwarf_ea51c5::mergeSegments
                  (in_stack_ffffffffffffde80,(int)((ulong)QVar6.d.ptr >> 0x20),(Segment *)in_RDI,
                   in_stack_ffffffffffffde6c);
        in_stack_ffffffffffffde50 = pQVar8;
        in_stack_ffffffffffffde58 = local_214c;
      }
      pQVar8 = (QVarLengthArray<(anonymous_namespace)::Segment,_256LL> *)
               QVLABase<(anonymous_namespace)::Segment>::operator[]
                         ((QVLABase<(anonymous_namespace)::Segment> *)
                          CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x65232c);
      local_214c = local_2168;
      iVar1 = local_2168 * 4 + iVar1;
      iVar7 = QRect::height((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffde48));
      iVar7 = iVar2 + iVar7;
      in_stack_ffffffffffffde4c = iVar2;
    }
    for (local_2178 = 0; local_2178 < iVar1; local_2178 = local_2178 + 1) {
      pvVar5 = QVLABase<(anonymous_namespace)::Segment>::operator[]
                         ((QVLABase<(anonymous_namespace)::Segment> *)
                          CONCAT44(in_stack_ffffffffffffde4c,in_stack_ffffffffffffde48),0x6523a7);
      if (-1 < (char)(*(char *)pvVar5 << 6)) {
        anon_unknown.dwarf_ea51c5::addSegmentsToPath
                  ((Segment *)CONCAT44(in_stack_ffffffffffffde6c,in_stack_ffffffffffffde68),
                   (QPainterPath *)in_stack_ffffffffffffde60);
      }
    }
    QVarLengthArray<(anonymous_namespace)::Segment,_256LL>::~QVarLengthArray
              (in_stack_ffffffffffffde50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)QVar6.d.ptr;
}

Assistant:

Q_GUI_EXPORT QPainterPath qt_regionToPath(const QRegion &region)
{
    QPainterPath result;
    if (region.rectCount() == 1) {
        result.addRect(region.boundingRect());
        return result;
    }

    auto rect = region.begin();
    const auto end = region.end();

    QVarLengthArray<Segment> segments;
    segments.resize(4 * (end - rect));

    int lastRowSegmentCount = 0;
    Segment *lastRowSegments = nullptr;

    int lastSegment = 0;
    int lastY = 0;
    while (rect != end) {
        const int y = rect[0].y();
        int count = 0;
        while (&rect[count] != end && rect[count].y() == y)
            ++count;

        for (int i = 0; i < count; ++i) {
            int offset = lastSegment + i;
            segments[offset] = Segment(rect[i].topLeft());
            segments[offset += count] = Segment(rect[i].topRight() + QPoint(1, 0));
            segments[offset += count] = Segment(rect[i].bottomRight() + QPoint(1, 1));
            segments[offset += count] = Segment(rect[i].bottomLeft() + QPoint(0, 1));

            offset = lastSegment + i;
            for (int j = 0; j < 4; ++j)
                segments[offset + j * count].connect(segments[offset + ((j + 1) % 4) * count]);
        }

        if (lastRowSegments && lastY == y)
            mergeSegments(lastRowSegments, lastRowSegmentCount, &segments[lastSegment], count);

        lastRowSegments = &segments[lastSegment + 2 * count];
        lastRowSegmentCount = count;
        lastSegment += 4 * count;
        lastY = y + rect[0].height();
        rect += count;
    }

    for (int i = 0; i < lastSegment; ++i) {
        Segment *segment = &segments[i];
        if (!segment->added)
            addSegmentsToPath(segment, result);
    }

    return result;
}